

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O3

void __thiscall
cbtGImpactCompoundShape::calculateLocalInertia
          (cbtGImpactCompoundShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  float fVar1;
  float fVar2;
  cbtScalar cVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  undefined8 uVar7;
  cbtCollisionShape *pcVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  cbtTransform *pcVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  cbtVector3 temp_inertia;
  float local_38;
  float local_34;
  float local_30;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  iVar14 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
             _vptr_cbtCollisionShape[0x16])(this);
  if (iVar14 != 0) {
    lVar17 = (long)iVar14;
    lVar18 = lVar17 << 6;
    do {
      lVar18 = lVar18 + -0x40;
      pcVar8 = (this->m_childShapes).m_data[lVar17 + -1];
      (*pcVar8->_vptr_cbtCollisionShape[8])((ulong)(uint)(mass / (float)iVar14),pcVar8,&local_38);
      iVar15 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.
                 super_cbtCollisionShape._vptr_cbtCollisionShape[0x17])(this);
      if ((char)iVar15 == '\0') {
        pcVar16 = cbtTransform::getIdentity();
        fVar1 = (pcVar16->m_basis).m_el[0].m_floats[0];
        fVar2 = (pcVar16->m_basis).m_el[1].m_floats[0];
        cVar3 = (pcVar16->m_basis).m_el[2].m_floats[0];
        fVar22 = (pcVar16->m_basis).m_el[0].m_floats[1];
        fVar24 = (pcVar16->m_basis).m_el[1].m_floats[1];
        fVar4 = (pcVar16->m_basis).m_el[0].m_floats[2];
        fVar5 = (pcVar16->m_basis).m_el[1].m_floats[2];
        cVar6 = (pcVar16->m_basis).m_el[2].m_floats[2];
        fVar10 = fVar1 * local_38;
        fVar11 = fVar2 * local_38;
        auVar19 = vmulss_avx512f(ZEXT416((uint)local_38),ZEXT416((uint)cVar3));
        fVar23 = (pcVar16->m_basis).m_el[2].m_floats[1];
      }
      else {
        lVar9 = *(long *)&this->field_0xd8;
        fVar1 = *(float *)(lVar9 + lVar18);
        fVar2 = *(float *)(lVar9 + 0x10 + lVar18);
        cVar3 = *(cbtScalar *)(lVar9 + 0x20 + lVar18);
        fVar22 = *(float *)(lVar9 + 4 + lVar18);
        fVar4 = *(float *)(lVar9 + 8 + lVar18);
        fVar24 = *(float *)(lVar9 + 0x14 + lVar18);
        fVar5 = *(float *)(lVar9 + 0x18 + lVar18);
        cVar6 = *(cbtScalar *)(lVar9 + 0x28 + lVar18);
        pcVar16 = (cbtTransform *)(lVar9 + lVar18);
        fVar10 = fVar1 * local_38;
        fVar11 = fVar2 * local_38;
        auVar19 = vmulss_avx512f(ZEXT416((uint)local_38),ZEXT416((uint)cVar3));
        fVar23 = *(float *)(lVar9 + 0x24 + lVar18);
      }
      uVar7 = *(undefined8 *)(pcVar16->m_origin).m_floats;
      auVar20 = vmulss_avx512f(ZEXT416((uint)local_30),ZEXT416((uint)cVar6));
      lVar17 = lVar17 + -1;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22 * local_34)),ZEXT416((uint)fVar1),
                                ZEXT416((uint)fVar10));
      fVar22 = (pcVar16->m_origin).m_floats[2];
      auVar21 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar23 * local_34 * fVar23)),ZEXT416((uint)cVar3)
                                    ,auVar19);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar24 * local_34)),ZEXT416((uint)fVar2),
                                ZEXT416((uint)fVar11));
      auVar13 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar4),ZEXT416((uint)(fVar4 * local_30)));
      auVar20 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar6),auVar20);
      fVar24 = (float)uVar7;
      fVar23 = (float)((ulong)uVar7 >> 0x20);
      auVar21._0_4_ = fVar24 * fVar24;
      auVar21._4_4_ = fVar23 * fVar23;
      auVar21._8_8_ = 0;
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar5),ZEXT416((uint)(fVar5 * local_30)));
      fVar22 = fVar22 * fVar22;
      auVar12 = vmovshdup_avx(auVar21);
      auVar19 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ * (auVar12._0_4_ + fVar22) +
                                            inertia->m_floats[0])),
                              ZEXT416((uint)(auVar19._0_4_ * (auVar21._0_4_ + fVar22) +
                                            inertia->m_floats[1])),0x10);
      fVar22 = inertia->m_floats[2];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
      uVar7 = vmovlps_avx(auVar19);
      *(undefined8 *)inertia->m_floats = uVar7;
      auVar19._4_12_ = SUB1612(auVar13 << 0x40,4);
      auVar19._0_4_ = auVar20._0_4_ * (auVar21._0_4_ + auVar12._0_4_) + fVar22;
      uVar7 = vmovlps_avx(auVar19);
      *(undefined8 *)(inertia->m_floats + 2) = uVar7;
    } while (lVar17 != 0);
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactCompoundShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();
#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getNumChildShapes();
	cbtScalar shapemass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 temp_inertia;
		m_childShapes[i]->calculateLocalInertia(shapemass, temp_inertia);
		if (childrenHasTransform())
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, m_childTransforms[i]);
		}
		else
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, cbtTransform::getIdentity());
		}
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif
	unlockChildShapes();
}